

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O1

uint cio_write(opj_cio_t *cio,unsigned_long_long v,int n)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = n + 1;
  iVar3 = n * 8;
  while( true ) {
    iVar3 = iVar3 + -8;
    iVar2 = iVar2 + -1;
    if (iVar2 < 1) {
      return n;
    }
    puVar1 = cio->bp;
    if (cio->end <= puVar1) break;
    cio->bp = puVar1 + 1;
    *puVar1 = (uchar)(v >> ((byte)iVar3 & 0x3f));
  }
  opj_event_msg(cio->cinfo,1,"write error\n");
  return 0;
}

Assistant:

unsigned int cio_write(opj_cio_t *cio, unsigned long long int v, int n) {
	int i;
	for (i = n - 1; i >= 0; i--) {
		if( !cio_byteout(cio, (unsigned char) ((v >> (i << 3)) & 0xff)) )
			return 0;
	}
	return n;
}